

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O0

int Gia_VtaPerformInt(Gia_Man_t *pAig,Abs_Par_t *pPars)

{
  long lVar1;
  long lVar2;
  sat_solver2 *s;
  long lVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  Abs_Par_t *p_00;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  abctime aVar16;
  Gia_Obj_t *pGVar17;
  Abc_Cex_t *pAVar18;
  Vec_Int_t *pVVar19;
  abctime aVar20;
  Vec_Int_t *pVVar21;
  char *pcVar22;
  Abc_Frame_t *pAbc;
  abctime aVar23;
  abctime aVar24;
  double local_560;
  double local_548;
  double local_530;
  double local_518;
  double local_500;
  char *local_4e8;
  char local_458 [8];
  char Command [1000];
  int nConflsBeg;
  abctime clk2;
  abctime clk;
  int fOneIsSent;
  int nCountNoChange;
  int RetValue;
  int nObjOld;
  int Status;
  int nConfls;
  int f;
  int i;
  Abc_Cex_t *pCex;
  Vec_Int_t *vCore;
  Vta_Man_t *p;
  Abs_Par_t *pPars_local;
  Gia_Man_t *pAig_local;
  
  _f = (Abc_Cex_t *)0x0;
  fOneIsSent = -1;
  clk._4_4_ = 0;
  bVar11 = false;
  p = (Vta_Man_t *)pPars;
  pPars_local = (Abs_Par_t *)pAig;
  aVar16 = Abc_Clock();
  iVar12 = Gia_ManPoNum((Gia_Man_t *)pPars_local);
  if (iVar12 != 1) {
    __assert_fail("Gia_ManPoNum(pAig) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                  ,0x5dc,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
  }
  if ((*(int *)&p->pGia != 0) && (*(int *)&p->pGia < *(int *)((long)&p->pGia + 4))) {
    __assert_fail("pPars->nFramesMax == 0 || pPars->nFramesStart <= pPars->nFramesMax",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                  ,0x5dd,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
  }
  pGVar17 = Gia_ManPo((Gia_Man_t *)pPars_local,0);
  pGVar17 = Gia_ObjFanin0(pGVar17);
  iVar12 = Gia_ObjIsConst0(pGVar17);
  if (iVar12 == 0) {
    lVar2._0_4_ = pPars_local[2].iFrame;
    lVar2._4_4_ = pPars_local[2].iFrameProved;
    if (lVar2 == 0) {
      pVVar19 = Vec_IntAlloc(5);
      *(Vec_Int_t **)&pPars_local[2].iFrame = pVVar19;
      Vec_IntPush(*(Vec_Int_t **)&pPars_local[2].iFrame,1);
      Vec_IntPush(*(Vec_Int_t **)&pPars_local[2].iFrame,3);
      Vec_IntPush(*(Vec_Int_t **)&pPars_local[2].iFrame,4);
      p_00 = pPars_local;
      pVVar19 = *(Vec_Int_t **)&pPars_local[2].iFrame;
      pGVar17 = Gia_ManPo((Gia_Man_t *)pPars_local,0);
      iVar12 = Gia_ObjFaninId0p((Gia_Man_t *)p_00,pGVar17);
      Vec_IntPush(pVVar19,iVar12);
    }
    vCore = (Vec_Int_t *)Vga_ManStart((Gia_Man_t *)pPars_local,(Abs_Par_t *)p);
    if (((Vta_Man_t *)vCore)->pPars->nTimeOut != 0) {
      s = ((Vta_Man_t *)vCore)->pSat;
      iVar12 = ((Vta_Man_t *)vCore)->pPars->nTimeOut;
      aVar20 = Abc_Clock();
      sat_solver2_set_runtime_limit(s,(long)iVar12 * 1000000 + aVar20);
    }
    if (vCore->pArray[0x1c] != 0) {
      Abc_Print(1,"Running variable-timeframe abstraction (VTA) with the following parameters:\n");
      Abc_Print(1,"FramePast = %d  FrameMax = %d  ConfMax = %d  Timeout = %d  RatioMin = %d %%\n",
                (ulong)*(uint *)&p->pPars,(ulong)*(uint *)&p->pGia,
                (ulong)*(uint *)((long)&p->pPars + 4),(ulong)*(uint *)&p->pBins,
                *(undefined4 *)((long)&p->pBins + 4));
      Abc_Print(1,"LearnStart = %d  LearnDelta = %d  LearnRatio = %d %%.\n",
                (ulong)(uint)p->nObjsAlloc,(ulong)(uint)p->nBins,(ulong)*(uint *)&p->field_0x1c);
      Abc_Print(1,
                " Frame   %%   Abs   %%   Confl  Cex   Vars   Clas   Lrns   Core     Time      Mem\n"
               );
    }
    iVar12 = Vec_PtrSize(*(Vec_Ptr_t **)(vCore + 4));
    if (iVar12 < 1) {
      __assert_fail("Vec_PtrSize(p->vFrames) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                    ,0x604,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
    }
    nConfls = 0;
    Status = 0;
    while( true ) {
      bVar10 = true;
      if (*vCore->pArray != 0) {
        bVar10 = Status < *vCore->pArray;
      }
      if (!bVar10) goto LAB_0075a454;
      Command._996_4_ = sat_solver2_nconflicts((sat_solver2 *)vCore[7].pArray);
      vCore->pArray[0x1e] = Status;
      if (Status == *(int *)&vCore[4].pArray << 5) {
        iVar12 = Vec_IntDoubleWidth((Vec_Int_t *)vCore[5].pArray,*(int *)&vCore[4].pArray);
        *(int *)&vCore[4].pArray = iVar12;
      }
      iVar12 = vCore[1].nCap;
      sat_solver2_bookmark((sat_solver2 *)vCore[7].pArray);
      Vec_IntClear(*(Vec_Int_t **)(vCore + 8));
      Vga_ManAddClausesOne((Vta_Man_t *)vCore,0,Status);
      iVar13 = Status;
      iVar14 = Vec_PtrSize(*(Vec_Ptr_t **)(vCore + 4));
      pVVar19 = vCore;
      if (iVar13 < iVar14) {
        pVVar21 = (Vec_Int_t *)Vec_PtrEntry(*(Vec_Ptr_t **)(vCore + 4),Status);
        Vga_ManLoadSlice((Vta_Man_t *)pVVar19,pVVar21,0);
      }
      else {
        for (nConfls = 1; iVar13 = nConfls, iVar14 = Abc_MinInt(vCore->pArray[2],Status),
            pVVar19 = vCore, iVar13 <= iVar14; nConfls = nConfls + 1) {
          pVVar21 = (Vec_Int_t *)Vec_PtrEntry(*(Vec_Ptr_t **)(vCore + 7),Status - nConfls);
          Vga_ManLoadSlice((Vta_Man_t *)pVVar19,pVVar21,nConfls);
        }
      }
      nConfls = 0;
      while( true ) {
        aVar20 = Abc_Clock();
        iVar13 = Vga_ManGetOutLit((Vta_Man_t *)vCore,Status);
        pCex = (Abc_Cex_t *)
               Vta_ManUnsatCore(iVar13,(sat_solver2 *)vCore[7].pArray,*(int *)((long)&p->pPars + 4),
                                *(int *)&p->vCores,&RetValue,&nObjOld);
        if ((pCex != (Abc_Cex_t *)0x0) != (RetValue == 1)) {
          __assert_fail("(vCore != NULL) == (Status == 1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                        ,0x621,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
        }
        if (RetValue == -1) {
          Vga_ManRollBack((Vta_Man_t *)vCore,iVar12);
          goto LAB_0075a454;
        }
        if ((*(long *)(vCore[7].pArray + 0x98) != 0) &&
           (aVar23 = Abc_Clock(), *(long *)(vCore[7].pArray + 0x98) < aVar23)) {
          Vga_ManRollBack((Vta_Man_t *)vCore,iVar12);
          goto LAB_0075a454;
        }
        if (pCex != (Abc_Cex_t *)0x0) break;
        aVar23 = Abc_Clock();
        vCore[8].pArray = (int *)((aVar23 - aVar20) + (long)vCore[8].pArray);
        if (RetValue != 0) {
          __assert_fail("Status == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                        ,0x633,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
        }
        *(int *)((long)&vCore[4].pArray + 4) = *(int *)((long)&vCore[4].pArray + 4) + 1;
        aVar20 = Abc_Clock();
        _f = Vta_ManRefineAbstraction((Vta_Man_t *)vCore,Status);
        aVar23 = Abc_Clock();
        pVVar19 = vCore;
        vCore[9].pArray = (int *)((aVar23 - aVar20) + (long)vCore[9].pArray);
        if (_f != (Abc_Cex_t *)0x0) goto LAB_0075a454;
        iVar14 = Status + 1;
        iVar15 = sat_solver2_nconflicts((sat_solver2 *)vCore[7].pArray);
        iVar13 = nConfls;
        iVar15 = iVar15 - Command._996_4_;
        aVar20 = Abc_Clock();
        Vta_ManAbsPrintFrame
                  ((Vta_Man_t *)pVVar19,(Vec_Int_t *)0x0,iVar14,iVar15,iVar13,aVar20 - aVar16,
                   vCore->pArray[0x1c]);
        nConfls = nConfls + 1;
      }
      aVar23 = Abc_Clock();
      *(abctime *)(vCore + 9) = (aVar23 - aVar20) + *(long *)(vCore + 9);
      if (RetValue != 1) {
        __assert_fail("Status == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                      ,0x63e,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
      }
      Vta_ManUnsatCoreRemap((Vta_Man_t *)vCore,(Vec_Int_t *)pCex);
      Vec_IntSort((Vec_Int_t *)pCex,1);
      sat_solver2_rollback((sat_solver2 *)vCore[7].pArray);
      Vga_ManRollBack((Vta_Man_t *)vCore,iVar12);
      Vga_ManLoadSlice((Vta_Man_t *)vCore,(Vec_Int_t *)pCex,0);
      Vec_IntFree((Vec_Int_t *)pCex);
      aVar20 = Abc_Clock();
      iVar12 = Vga_ManGetOutLit((Vta_Man_t *)vCore,Status);
      pCex = (Abc_Cex_t *)
             Vta_ManUnsatCore(iVar12,(sat_solver2 *)vCore[7].pArray,*(int *)((long)&p->pPars + 4),
                              vCore->pArray[0x1c],&RetValue,&nObjOld);
      aVar23 = Abc_Clock();
      *(abctime *)(vCore + 9) = (aVar23 - aVar20) + *(long *)(vCore + 9);
      if ((pCex != (Abc_Cex_t *)0x0) != (RetValue == 1)) {
        __assert_fail("(vCore != NULL) == (Status == 1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                      ,0x64e,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
      }
      if (RetValue == -1) goto LAB_0075a454;
      if (RetValue == 0) {
        Vta_ManSatVerify((Vta_Man_t *)vCore);
        lVar3._0_4_ = pPars_local[2].iFrame;
        lVar3._4_4_ = pPars_local[2].iFrameProved;
        if ((lVar3 != 0) || (vCore->pArray[1] <= Status)) {
          __assert_fail("pAig->vObjClasses == NULL && f < p->pPars->nFramesStart",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                        ,0x655,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
        }
        _f = Vga_ManDeriveCex((Vta_Man_t *)vCore);
        goto LAB_0075a454;
      }
      Vta_ManUnsatCoreRemap((Vta_Man_t *)vCore,(Vec_Int_t *)pCex);
      Vec_IntSort((Vec_Int_t *)pCex,1);
      Vec_PtrPush(*(Vec_Ptr_t **)(vCore + 7),pCex);
      pVVar19 = vCore;
      pAVar18 = pCex;
      iVar13 = Status + 1;
      iVar14 = sat_solver2_nconflicts((sat_solver2 *)vCore[7].pArray);
      iVar12 = nConfls;
      iVar14 = iVar14 - Command._996_4_;
      aVar20 = Abc_Clock();
      iVar12 = Vta_ManAbsPrintFrame
                         ((Vta_Man_t *)pVVar19,(Vec_Int_t *)pAVar18,iVar13,iVar14,iVar12,
                          aVar20 - aVar16,vCore->pArray[0x1c]);
      if (iVar12 == 0) {
        clk._4_4_ = clk._4_4_ + 1;
        if (clk._4_4_ == 2) {
          vCore->pArray[0x20] = vCore->pArray[0x20] + 1;
          iVar12 = Abc_FrameIsBridgeMode();
          if (iVar12 != 0) {
            if (bVar11) {
              Gia_VtaSendCancel((Vta_Man_t *)vCore,*(int *)&p->vCores);
            }
            Gia_VtaSendAbsracted((Vta_Man_t *)vCore,*(int *)&p->vCores);
            bVar11 = true;
          }
        }
      }
      else {
        clk._4_4_ = 1;
        vCore->pArray[0x20] = 0;
      }
      if ((vCore->pArray[0x15] != 0) && ((Status & 1U) != 0)) {
        Abc_FrameSetStatus(-1);
        Abc_FrameSetCex((Abc_Cex_t *)0x0);
        Abc_FrameSetNFrames(Status + 1);
        if (*(long *)(vCore->pArray + 0x1a) == 0) {
          local_4e8 = "vtabs.aig";
        }
        else {
          local_4e8 = *(char **)(vCore->pArray + 0x1a);
        }
        pcVar22 = Extra_FileNameGenericAppend(local_4e8,".status");
        sprintf(local_458,"write_status %s",pcVar22);
        pAbc = Abc_FrameGetGlobalFrame();
        Cmd_CommandExecute(pAbc,local_458);
        Gia_VtaDumpAbsracted((Vta_Man_t *)vCore,*(int *)&p->vCores);
      }
      iVar12 = *(int *)&vCore[6].pArray;
      iVar13 = Gia_ManCandNum((Gia_Man_t *)pPars_local);
      if ((iVar13 * (100 - *(int *)((long)&p->pBins + 4))) / 100 <= iVar12) break;
      Status = Status + 1;
    }
    RetValue = -1;
LAB_0075a454:
    if (_f == (Abc_Cex_t *)0x0) {
      if ((vCore->pArray[0x1c] != 0) && (RetValue == -1)) {
        printf("\n");
      }
      iVar12 = Vec_PtrSize(*(Vec_Ptr_t **)(vCore + 7));
      if (iVar12 == 0) {
        Abc_Print(1,"Abstraction is not produced because first frame is not solved.  ");
      }
      else {
        iVar12 = Vec_PtrSize(*(Vec_Ptr_t **)(vCore + 7));
        if (iVar12 < 1) {
          __assert_fail("Vec_PtrSize(p->vCores) > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                        ,0x68e,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
        }
        Vec_IntFreeP((Vec_Int_t **)&pPars_local[2].iFrame);
        pVVar19 = Gia_VtaFramesToAbs(*(Vec_Vec_t **)(vCore + 7));
        *(Vec_Int_t **)&pPars_local[2].iFrame = pVVar19;
        if (RetValue == -1) {
          if ((vCore->pArray[8] == 0) ||
             (aVar20 = Abc_Clock(), aVar20 < *(long *)(vCore[7].pArray + 0x98))) {
            if ((*(int *)((long)&p->pPars + 4) == 0) ||
               (iVar12 = sat_solver2_nconflicts((sat_solver2 *)vCore[7].pArray),
               iVar12 < *(int *)((long)&p->pPars + 4))) {
              iVar12 = *(int *)&vCore[6].pArray;
              iVar13 = Gia_ManCandNum((Gia_Man_t *)pPars_local);
              if (iVar12 < (iVar13 * (100 - *(int *)((long)&p->pBins + 4))) / 100) {
                Abc_Print(1,"Abstraction stopped for unknown reason in frame %d.  ",
                          (ulong)(uint)Status);
              }
              else {
                Abc_Print(1,"The ratio of abstracted objects is less than %d %% in frame %d.  ",
                          (ulong)*(uint *)((long)&p->pBins + 4),(ulong)(uint)Status);
              }
            }
            else {
              Abc_Print(1,"Exceeded %d conflicts in frame %d with a %d-stable abstraction.  ",
                        (ulong)*(uint *)((long)&p->pPars + 4),(ulong)(uint)Status,
                        (ulong)(uint)vCore->pArray[0x20]);
            }
          }
          else {
            Abc_Print(1,"Timeout %d sec in frame %d with a %d-stable abstraction.    ",
                      (ulong)(uint)vCore->pArray[8],(ulong)(uint)Status,
                      (ulong)(uint)vCore->pArray[0x20]);
          }
        }
        else {
          vCore->pArray[0x1e] = vCore->pArray[0x1e] + 1;
          Abc_Print(1,"VTA completed %d frames with a %d-stable abstraction.  ",(ulong)(uint)Status,
                    (ulong)(uint)vCore->pArray[0x20]);
        }
      }
    }
    else {
      if (vCore->pArray[0x1c] != 0) {
        printf("\n");
      }
      if (*(long *)(*(long *)vCore + 0x150) != 0) {
        free(*(void **)(*(long *)vCore + 0x150));
        *(undefined8 *)(*(long *)vCore + 0x150) = 0;
      }
      *(Abc_Cex_t **)(*(long *)vCore + 0x150) = _f;
      iVar12 = Gia_ManVerifyCex(*(Gia_Man_t **)vCore,_f,0);
      if (iVar12 == 0) {
        Abc_Print(1,"    Gia_VtaPerform(): CEX verification has failed!\n");
      }
      Abc_Print(1,"Counter-example detected in frame %d.  ",(ulong)(uint)Status);
      vCore->pArray[0x1e] = _f->iFrame + -1;
      Vec_IntFreeP((Vec_Int_t **)&pPars_local[2].iFrame);
      fOneIsSent = 0;
    }
    aVar20 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar20 - aVar16);
    if (vCore->pArray[0x1c] != 0) {
      aVar20 = Abc_Clock();
      *(abctime *)(vCore + 10) =
           (((aVar20 - aVar16) - *(long *)(vCore + 9)) - (long)vCore[8].pArray) -
           (long)vCore[9].pArray;
      Abc_Print(1,"%s =","Runtime: Solver UNSAT");
      lVar4._0_4_ = vCore[9].nCap;
      lVar4._4_4_ = vCore[9].nSize;
      aVar20 = Abc_Clock();
      if (aVar20 == aVar16) {
        local_500 = 0.0;
      }
      else {
        lVar5._0_4_ = vCore[9].nCap;
        lVar5._4_4_ = vCore[9].nSize;
        aVar20 = Abc_Clock();
        local_500 = ((double)lVar5 * 100.0) / (double)(aVar20 - aVar16);
      }
      Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)lVar4 * 1.0) / 1000000.0,local_500);
      Abc_Print(1,"%s =","Runtime: Solver SAT  ");
      piVar6 = vCore[8].pArray;
      aVar20 = Abc_Clock();
      if (aVar20 == aVar16) {
        local_518 = 0.0;
      }
      else {
        piVar7 = vCore[8].pArray;
        aVar20 = Abc_Clock();
        local_518 = ((double)(long)piVar7 * 100.0) / (double)(aVar20 - aVar16);
      }
      Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)(long)piVar6 * 1.0) / 1000000.0,local_518);
      Abc_Print(1,"%s =","Runtime: Refinement  ");
      piVar6 = vCore[9].pArray;
      aVar20 = Abc_Clock();
      if (aVar20 == aVar16) {
        local_530 = 0.0;
      }
      else {
        piVar7 = vCore[9].pArray;
        aVar20 = Abc_Clock();
        local_530 = ((double)(long)piVar7 * 100.0) / (double)(aVar20 - aVar16);
      }
      Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)(long)piVar6 * 1.0) / 1000000.0,local_530);
      Abc_Print(1,"%s =","Runtime: Other       ");
      lVar8._0_4_ = vCore[10].nCap;
      lVar8._4_4_ = vCore[10].nSize;
      aVar20 = Abc_Clock();
      if (aVar20 == aVar16) {
        local_548 = 0.0;
      }
      else {
        lVar9._0_4_ = vCore[10].nCap;
        lVar9._4_4_ = vCore[10].nSize;
        aVar20 = Abc_Clock();
        local_548 = ((double)lVar9 * 100.0) / (double)(aVar20 - aVar16);
      }
      Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)lVar8 * 1.0) / 1000000.0,local_548);
      Abc_Print(1,"%s =","Runtime: TOTAL       ");
      aVar20 = Abc_Clock();
      aVar23 = Abc_Clock();
      if (aVar23 == aVar16) {
        local_560 = 0.0;
      }
      else {
        aVar23 = Abc_Clock();
        aVar24 = Abc_Clock();
        local_560 = ((double)(aVar23 - aVar16) * 100.0) / (double)(aVar24 - aVar16);
      }
      Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)(aVar20 - aVar16) * 1.0) / 1000000.0,local_560);
      Gia_VtaPrintMemory((Vta_Man_t *)vCore);
    }
    Vga_ManStop((Vta_Man_t *)vCore);
    fflush(_stdout);
    pAig_local._4_4_ = fOneIsSent;
  }
  else {
    pGVar17 = Gia_ManPo((Gia_Man_t *)pPars_local,0);
    iVar12 = Gia_ObjFaninC0(pGVar17);
    if (iVar12 == 0) {
      printf("Sequential miter is trivially UNSAT.\n");
      pAig_local._4_4_ = 1;
    }
    else {
      lVar1._0_4_ = pPars_local[2].fNewRefine;
      lVar1._4_4_ = pPars_local[2].fUseSkip;
      if (lVar1 != 0) {
        free(*(void **)&pPars_local[2].fNewRefine);
        pPars_local[2].fNewRefine = 0;
        pPars_local[2].fUseSkip = 0;
      }
      iVar12 = Gia_ManRegNum((Gia_Man_t *)pPars_local);
      iVar13 = Gia_ManPiNum((Gia_Man_t *)pPars_local);
      pAVar18 = Abc_CexMakeTriv(iVar12,iVar13,1,0);
      *(Abc_Cex_t **)&pPars_local[2].fNewRefine = pAVar18;
      printf("Sequential miter is trivially SAT.\n");
      pAig_local._4_4_ = 0;
    }
  }
  return pAig_local._4_4_;
}

Assistant:

int Gia_VtaPerformInt( Gia_Man_t * pAig, Abs_Par_t * pPars )
{
    Vta_Man_t * p;
    Vec_Int_t * vCore;
    Abc_Cex_t * pCex = NULL;
    int i, f, nConfls, Status, nObjOld, RetValue = -1, nCountNoChange = 0, fOneIsSent = 0;
    abctime clk = Abc_Clock(), clk2;
    // preconditions
    assert( Gia_ManPoNum(pAig) == 1 );
    assert( pPars->nFramesMax == 0 || pPars->nFramesStart <= pPars->nFramesMax );
    if ( Gia_ObjIsConst0(Gia_ObjFanin0(Gia_ManPo(pAig,0))) )
    {
        if ( !Gia_ObjFaninC0(Gia_ManPo(pAig,0)) )
        {
            printf( "Sequential miter is trivially UNSAT.\n" );
            return 1;
        } 
        ABC_FREE( pAig->pCexSeq );
        pAig->pCexSeq = Abc_CexMakeTriv( Gia_ManRegNum(pAig), Gia_ManPiNum(pAig), 1, 0 );
        printf( "Sequential miter is trivially SAT.\n" );
        return 0;
    }

    // compute intial abstraction
    if ( pAig->vObjClasses == NULL )
    {
        pAig->vObjClasses = Vec_IntAlloc( 5 );
        Vec_IntPush( pAig->vObjClasses, 1 );
        Vec_IntPush( pAig->vObjClasses, 3 );
        Vec_IntPush( pAig->vObjClasses, 4 );
        Vec_IntPush( pAig->vObjClasses, Gia_ObjFaninId0p(pAig, Gia_ManPo(pAig, 0)) );
    }
    // start the manager
    p = Vga_ManStart( pAig, pPars );
    // set runtime limit
    if ( p->pPars->nTimeOut )
        sat_solver2_set_runtime_limit( p->pSat, p->pPars->nTimeOut * CLOCKS_PER_SEC + Abc_Clock() );
    // perform initial abstraction
    if ( p->pPars->fVerbose )
    {
        Abc_Print( 1, "Running variable-timeframe abstraction (VTA) with the following parameters:\n" );
        Abc_Print( 1, "FramePast = %d  FrameMax = %d  ConfMax = %d  Timeout = %d  RatioMin = %d %%\n", 
            pPars->nFramesPast, pPars->nFramesMax, pPars->nConfLimit, pPars->nTimeOut, pPars->nRatioMin );
        Abc_Print( 1, "LearnStart = %d  LearnDelta = %d  LearnRatio = %d %%.\n", 
            pPars->nLearnedStart, pPars->nLearnedDelta, pPars->nLearnedPerce );
//        Abc_Print( 1, "Frame   %%   Abs   %%   Confl  Cex    SatVar   Core   F0   F1   F2  ...\n" );
        Abc_Print( 1, " Frame   %%   Abs   %%   Confl  Cex   Vars   Clas   Lrns   Core     Time      Mem\n" );
    }
    assert( Vec_PtrSize(p->vFrames) > 0 );
    for ( f = i = 0; !p->pPars->nFramesMax || f < p->pPars->nFramesMax; f++ )
    {
        int nConflsBeg = sat_solver2_nconflicts(p->pSat);
        p->pPars->iFrame = f;
        // realloc storage for abstraction marks
        if ( f == p->nWords * 32 )
            p->nWords = Vec_IntDoubleWidth( p->vSeens, p->nWords );

        // create bookmark to be used for rollback
        nObjOld = p->nObjs;
        sat_solver2_bookmark( p->pSat );
        Vec_IntClear( p->vAddedNew );

        // load new timeframe
        Vga_ManAddClausesOne( p, 0, f );
        if ( f < Vec_PtrSize(p->vFrames) )
            Vga_ManLoadSlice( p, (Vec_Int_t *)Vec_PtrEntry(p->vFrames, f), 0 );
        else
        {
            for ( i = 1; i <= Abc_MinInt(p->pPars->nFramesPast, f); i++ )
                Vga_ManLoadSlice( p, (Vec_Int_t *)Vec_PtrEntry(p->vCores, f-i), i );
        }

        // iterate as long as there are counter-examples
        for ( i = 0; ; i++ )
        { 
            clk2 = Abc_Clock();
            vCore = Vta_ManUnsatCore( Vga_ManGetOutLit(p, f), p->pSat, pPars->nConfLimit, pPars->fVerbose, &Status, &nConfls );
            assert( (vCore != NULL) == (Status == 1) );
            if ( Status == -1 ) // resource limit is reached
            {
                Vga_ManRollBack( p, nObjOld );
                goto finish;
            }
            // check timeout
            if ( p->pSat->nRuntimeLimit && Abc_Clock() > p->pSat->nRuntimeLimit )
            {
                Vga_ManRollBack( p, nObjOld );
                goto finish;
            }
            if ( vCore != NULL )
            {
                p->timeUnsat += Abc_Clock() - clk2;
                break;
            }
            p->timeSat += Abc_Clock() - clk2;
            assert( Status == 0 );
            p->nCexes++;
            // perform the refinement
            clk2 = Abc_Clock();
            pCex = Vta_ManRefineAbstraction( p, f );
            p->timeCex += Abc_Clock() - clk2;
            if ( pCex != NULL )
                goto finish;
            // print the result (do not count it towards change)
            Vta_ManAbsPrintFrame( p, NULL, f+1, sat_solver2_nconflicts(p->pSat)-nConflsBeg, i, Abc_Clock() - clk, p->pPars->fVerbose );
        }
        assert( Status == 1 );
        // valid core is obtained
        Vta_ManUnsatCoreRemap( p, vCore );
        Vec_IntSort( vCore, 1 );
        // update the SAT solver
        sat_solver2_rollback( p->pSat );
        // update storage
        Vga_ManRollBack( p, nObjOld );
        // load this timeframe
        Vga_ManLoadSlice( p, vCore, 0 );
        Vec_IntFree( vCore );

        // run SAT solver
        clk2 = Abc_Clock();
        vCore = Vta_ManUnsatCore( Vga_ManGetOutLit(p, f), p->pSat, pPars->nConfLimit, p->pPars->fVerbose, &Status, &nConfls );
        p->timeUnsat += Abc_Clock() - clk2;
        assert( (vCore != NULL) == (Status == 1) );
        if ( Status == -1 ) // resource limit is reached
            break;
        if ( Status == 0 )
        {
            Vta_ManSatVerify( p );
            // make sure, there was no initial abstraction (otherwise, it was invalid)
            assert( pAig->vObjClasses == NULL && f < p->pPars->nFramesStart );
            pCex = Vga_ManDeriveCex( p );
            break;
        }
        // add the core
        Vta_ManUnsatCoreRemap( p, vCore );
        // add in direct topological order
        Vec_IntSort( vCore, 1 );
        Vec_PtrPush( p->vCores, vCore );
        // print the result
        if ( Vta_ManAbsPrintFrame( p, vCore, f+1, sat_solver2_nconflicts(p->pSat)-nConflsBeg, i, Abc_Clock() - clk, p->pPars->fVerbose ) )
        {
            // reset the counter of frames without change
            nCountNoChange = 1;
            p->pPars->nFramesNoChange = 0;
        }
        else if ( ++nCountNoChange == 2 ) // time to send
        {
            p->pPars->nFramesNoChange++;
            if ( Abc_FrameIsBridgeMode() )
            {
                // cancel old one if it was sent
                if ( fOneIsSent )
                    Gia_VtaSendCancel( p, pPars->fVerbose );
                // send new one 
                Gia_VtaSendAbsracted( p, pPars->fVerbose );
                fOneIsSent = 1;
            }
        }
        // dump the model
        if ( p->pPars->fDumpVabs && (f & 1) )
        {
            char Command[1000];
            Abc_FrameSetStatus( -1 );
            Abc_FrameSetCex( NULL );
            Abc_FrameSetNFrames( f+1 );
            sprintf( Command, "write_status %s", Extra_FileNameGenericAppend((char *)(p->pPars->pFileVabs ? p->pPars->pFileVabs : "vtabs.aig"), ".status") );
            Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Command );
            Gia_VtaDumpAbsracted( p, pPars->fVerbose );
        }
        // check if the number of objects is below limit
        if ( p->nSeenGla >= Gia_ManCandNum(pAig) * (100-pPars->nRatioMin) / 100 )
        {
            Status = -1;
            break;
        }
    }
finish:
    // analize the results
    if ( pCex == NULL )
    {
        if ( p->pPars->fVerbose && Status == -1 )
            printf( "\n" );
        if ( Vec_PtrSize(p->vCores) == 0 )
            Abc_Print( 1, "Abstraction is not produced because first frame is not solved.  " );
        else
        {
            assert( Vec_PtrSize(p->vCores) > 0 );
//            if ( pAig->vObjClasses != NULL )
//                Abc_Print( 1, "Replacing the old abstraction by a new one.\n" );
            Vec_IntFreeP( &pAig->vObjClasses );
            pAig->vObjClasses = Gia_VtaFramesToAbs( (Vec_Vec_t *)p->vCores );
            if ( Status == -1 )
            {
                if ( p->pPars->nTimeOut && Abc_Clock() >= p->pSat->nRuntimeLimit ) 
                    Abc_Print( 1, "Timeout %d sec in frame %d with a %d-stable abstraction.    ", p->pPars->nTimeOut, f, p->pPars->nFramesNoChange );
                else if ( pPars->nConfLimit && sat_solver2_nconflicts(p->pSat) >= pPars->nConfLimit )
                    Abc_Print( 1, "Exceeded %d conflicts in frame %d with a %d-stable abstraction.  ", pPars->nConfLimit, f, p->pPars->nFramesNoChange );
                else if ( p->nSeenGla >= Gia_ManCandNum(pAig) * (100-pPars->nRatioMin) / 100 )
                    Abc_Print( 1, "The ratio of abstracted objects is less than %d %% in frame %d.  ", pPars->nRatioMin, f );
                else
                    Abc_Print( 1, "Abstraction stopped for unknown reason in frame %d.  ", f );
            }
            else
            {
                p->pPars->iFrame++;
                Abc_Print( 1, "VTA completed %d frames with a %d-stable abstraction.  ", f, p->pPars->nFramesNoChange );
            }
        }
    }
    else
    {
        if ( p->pPars->fVerbose )
            printf( "\n" );
        ABC_FREE( p->pGia->pCexSeq );
        p->pGia->pCexSeq = pCex;
        if ( !Gia_ManVerifyCex( p->pGia, pCex, 0 ) )
            Abc_Print( 1, "    Gia_VtaPerform(): CEX verification has failed!\n" );
        Abc_Print( 1, "Counter-example detected in frame %d.  ", f );
        p->pPars->iFrame = pCex->iFrame - 1;
        Vec_IntFreeP( &pAig->vObjClasses );
        RetValue = 0;
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    if ( p->pPars->fVerbose )
    {
        p->timeOther = (Abc_Clock() - clk) - p->timeUnsat - p->timeSat - p->timeCex;
        ABC_PRTP( "Runtime: Solver UNSAT", p->timeUnsat,  Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Solver SAT  ", p->timeSat,    Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Refinement  ", p->timeCex,    Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Other       ", p->timeOther,  Abc_Clock() - clk );
        ABC_PRTP( "Runtime: TOTAL       ", Abc_Clock() - clk, Abc_Clock() - clk );
        Gia_VtaPrintMemory( p );
    }

    Vga_ManStop( p );
    fflush( stdout );
    return RetValue;
}